

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.h
# Opt level: O2

void __thiscall
cmOutputRequiredFilesCommand::cmOutputRequiredFilesCommand(cmOutputRequiredFilesCommand *this)

{
  (this->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (this->super_cmCommand).Error._M_dataplus._M_p = (pointer)&(this->super_cmCommand).Error.field_2;
  (this->super_cmCommand).Error._M_string_length = 0;
  (this->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCommand)._vptr_cmCommand =
       (_func_int **)&PTR__cmOutputRequiredFilesCommand_0064f018;
  (this->File)._M_dataplus._M_p = (pointer)&(this->File).field_2;
  (this->File)._M_string_length = 0;
  (this->File).field_2._M_local_buf[0] = '\0';
  (this->OutputFile)._M_dataplus._M_p = (pointer)&(this->OutputFile).field_2;
  (this->OutputFile)._M_string_length = 0;
  (this->OutputFile).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmCommand()
    : Makefile(CM_NULLPTR)
  {
  }